

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

bool testing::internal::SkipPrefix(char *prefix,char **pstr)

{
  int iVar1;
  size_t __n;
  long *in_RSI;
  char *in_RDI;
  size_t prefix_len;
  
  __n = strlen(in_RDI);
  iVar1 = strncmp((char *)*in_RSI,in_RDI,__n);
  if (iVar1 == 0) {
    *in_RSI = __n + *in_RSI;
  }
  return iVar1 == 0;
}

Assistant:

bool SkipPrefix(const char* prefix, const char** pstr) {
  const size_t prefix_len = strlen(prefix);
  if (strncmp(*pstr, prefix, prefix_len) == 0) {
    *pstr += prefix_len;
    return true;
  }
  return false;
}